

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O0

void joystick_callback(int joy,int event)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  int local_1c;
  uint local_18;
  int i;
  int button_count;
  int axis_count;
  int event_local;
  int joy_local;
  
  button_count = event;
  axis_count = joy;
  if (event == 0x40001) {
    glfwGetJoystickAxes(joy,&i);
    glfwGetJoystickButtons(axis_count,(int *)&local_18);
    uVar2 = axis_count + 1;
    pcVar3 = glfwGetJoystickName(axis_count);
    printf("Found joystick %i named \'%s\' with %i axes, %i buttons\n",(ulong)uVar2,pcVar3,
           (ulong)(uint)i,(ulong)local_18);
    lVar4 = (long)joystick_count;
    joystick_count = joystick_count + 1;
    joysticks[lVar4] = axis_count;
  }
  else if (event == 0x40002) {
    for (local_1c = 0; (iVar1 = local_1c, local_1c < joystick_count && (joysticks[local_1c] != joy))
        ; local_1c = local_1c + 1) {
    }
    while (local_1c = iVar1 + 1, local_1c < joystick_count) {
      joysticks[iVar1] = joysticks[local_1c];
      iVar1 = local_1c;
    }
    printf("Lost joystick %i\n",(ulong)(joy + 1));
    joystick_count = joystick_count + -1;
  }
  return;
}

Assistant:

static void joystick_callback(int joy, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int axis_count, button_count;

        glfwGetJoystickAxes(joy, &axis_count);
        glfwGetJoystickButtons(joy, &button_count);

        printf("Found joystick %i named \'%s\' with %i axes, %i buttons\n",
                joy + 1,
                glfwGetJoystickName(joy),
                axis_count,
                button_count);

        joysticks[joystick_count++] = joy;
    }
    else if (event == GLFW_DISCONNECTED)
    {
        int i;

        for (i = 0;  i < joystick_count;  i++)
        {
            if (joysticks[i] == joy)
                break;
        }

        for (i = i + 1;  i < joystick_count;  i++)
            joysticks[i - 1] = joysticks[i];

        printf("Lost joystick %i\n", joy + 1);
        joystick_count--;
    }
}